

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O3

bool __thiscall crnlib::dds_comp::create_dds_tex(dds_comp *this,mipmapped_texture *dds_tex)

{
  color_quad<unsigned_char,_int> *pcVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  undefined8 uVar3;
  void *p;
  vector<crnlib::mip_level_*> *pvVar4;
  bool bVar5;
  conversion_type conv_type;
  long lVar6;
  mip_level *this_00;
  image_u8 *piVar7;
  crn_comp_params *pcVar8;
  uint uVar9;
  uint *puVar10;
  image_u8 *piVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  crn_uint32 min_new_capacity;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  face_vec faces;
  image_u8 images [6] [16];
  ulong local_1290;
  image_u8 *local_1280;
  image<crnlib::color_quad<unsigned_char,_int>_> local_1278;
  mipmapped_texture *local_1248;
  ulong local_1240;
  image_u8 local_1238 [96];
  
  local_1248 = dds_tex;
  lVar6 = 0x18;
  do {
    *(undefined8 *)((long)&local_1278.m_pixel_buf.m_size + lVar6) = 0;
    *(undefined8 *)((long)&local_1248 + lVar6) = 0;
    *(undefined4 *)((long)local_1238 + lVar6 + -8) = 0xf;
    *(undefined8 *)((long)&local_1238[0].m_width + lVar6) = 0;
    *(undefined8 *)((long)&local_1238[0].m_pitch + lVar6) = 0;
    *(undefined8 *)((long)&local_1238[0].m_comp_flags + lVar6) = 0;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x1218);
  pcVar8 = this->m_pParams;
  if (pcVar8->m_faces == 0) {
    uVar9 = 0;
  }
  else {
    local_1290 = 0x28;
    piVar11 = local_1238;
    uVar17 = 0;
    uVar9 = 0;
    do {
      local_1240 = uVar17;
      if (pcVar8->m_levels != 0) {
        uVar17 = 0;
        piVar7 = piVar11;
        do {
          uVar18 = pcVar8->m_width >> ((byte)uVar17 & 0x1f);
          uVar19 = uVar18 + (uVar18 == 0);
          uVar18 = pcVar8->m_height >> ((byte)uVar17 & 0x1f);
          uVar12 = uVar18 + (uVar18 == 0);
          pcVar1 = *(color_quad<unsigned_char,_int> **)
                    ((long)(pcVar8->m_pImages + -1) + 0x58 + uVar17 * 8 + local_1290);
          if (pcVar1 == (color_quad<unsigned_char,_int> *)0x0) {
            bVar5 = false;
            goto LAB_0016b736;
          }
          pcVar2 = (piVar7->m_pixel_buf).m_p;
          if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(pcVar2);
            (piVar7->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
            (piVar7->m_pixel_buf).m_size = 0;
            (piVar7->m_pixel_buf).m_capacity = 0;
          }
          piVar7->m_pPixels = pcVar1;
          piVar7->m_width = uVar19;
          piVar7->m_height = uVar12;
          piVar7->m_pitch = uVar19;
          piVar7->m_total = uVar12 * uVar19;
          piVar7->m_comp_flags = 0xf;
          if (uVar9 == 0) {
            bVar5 = image_utils::has_alpha(piVar7);
            uVar9 = (uint)bVar5;
          }
          uVar17 = uVar17 + 1;
          pcVar8 = this->m_pParams;
          piVar7 = piVar7 + 1;
        } while (uVar17 < pcVar8->m_levels);
      }
      uVar17 = local_1240 + 1;
      local_1290 = local_1290 + 0x80;
      piVar11 = piVar11 + 0x10;
    } while (uVar17 < pcVar8->m_faces);
    uVar9 = uVar9 << 3;
  }
  uVar17 = (ulong)pcVar8->m_faces;
  if (pcVar8->m_faces != 0) {
    uVar15 = (ulong)pcVar8->m_levels;
    puVar10 = &local_1238[0].m_comp_flags;
    uVar13 = 0;
    do {
      iVar14 = (int)uVar15;
      uVar15 = 0;
      if (iVar14 != 0) {
        uVar17 = 0;
        puVar16 = puVar10;
        do {
          *puVar16 = *puVar16 & 0xfffffff7 | uVar9;
          uVar17 = uVar17 + 1;
          uVar15 = (ulong)pcVar8->m_levels;
          puVar16 = puVar16 + 0xc;
        } while (uVar17 < uVar15);
        uVar17 = (ulong)pcVar8->m_faces;
      }
      uVar13 = uVar13 + 1;
      puVar10 = puVar10 + 0xc0;
    } while (uVar13 < uVar17);
  }
  conv_type = image_utils::get_image_conversion_type_from_crn_format(pcVar8->m_format);
  pcVar8 = this->m_pParams;
  min_new_capacity = pcVar8->m_faces;
  if (conv_type != cConversion_Invalid) {
    if (min_new_capacity == 0) {
      local_1278._0_8_ = (vector<crnlib::mip_level_*> *)0x0;
      local_1278.m_pitch = 0;
      local_1278.m_total = 0;
      goto LAB_0016b567;
    }
    piVar11 = local_1238;
    uVar17 = 0;
    do {
      if (pcVar8->m_levels != 0) {
        uVar13 = 0;
        piVar7 = piVar11;
        do {
          image<crnlib::color_quad<unsigned_char,_int>_>::image(&local_1278,piVar7);
          image_utils::convert_image(&local_1278,conv_type);
          pvVar4 = *(vector<crnlib::mip_level_*> **)piVar7;
          uVar15._0_4_ = piVar7->m_pitch;
          uVar15._4_4_ = piVar7->m_total;
          piVar7->m_width = local_1278.m_width;
          piVar7->m_height = local_1278.m_height;
          piVar7->m_pitch = local_1278.m_pitch;
          piVar7->m_total = local_1278.m_total;
          uVar12 = piVar7->m_comp_flags;
          piVar7->m_comp_flags = local_1278.m_comp_flags;
          pcVar1 = piVar7->m_pPixels;
          pcVar2 = (piVar7->m_pixel_buf).m_p;
          *(undefined4 *)&piVar7->m_pPixels = local_1278.m_pPixels._0_4_;
          *(undefined4 *)((long)&piVar7->m_pPixels + 4) = local_1278.m_pPixels._4_4_;
          *(undefined4 *)&(piVar7->m_pixel_buf).m_p = local_1278.m_pixel_buf.m_p._0_4_;
          *(undefined4 *)((long)&(piVar7->m_pixel_buf).m_p + 4) = local_1278.m_pixel_buf.m_p._4_4_;
          uVar3._0_4_ = (piVar7->m_pixel_buf).m_size;
          uVar3._4_4_ = (piVar7->m_pixel_buf).m_capacity;
          (piVar7->m_pixel_buf).m_size = local_1278.m_pixel_buf.m_size;
          (piVar7->m_pixel_buf).m_capacity = local_1278.m_pixel_buf.m_capacity;
          local_1278._0_8_ = pvVar4;
          local_1278._8_8_ = uVar15;
          local_1278.m_comp_flags = uVar12;
          local_1278.m_pPixels = pcVar1;
          local_1278.m_pixel_buf.m_p = pcVar2;
          local_1278.m_pixel_buf._8_8_ = uVar3;
          if (pcVar2 != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(pcVar2);
          }
          uVar13 = uVar13 + 1;
          pcVar8 = this->m_pParams;
          piVar7 = piVar7 + 1;
        } while (uVar13 < pcVar8->m_levels);
      }
      uVar17 = uVar17 + 1;
      min_new_capacity = pcVar8->m_faces;
      piVar11 = piVar11 + 0x10;
    } while (uVar17 < min_new_capacity);
  }
  local_1278._0_8_ = (vector<crnlib::mip_level_*> *)0x0;
  local_1278.m_pitch = 0;
  local_1278.m_total = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_1278,min_new_capacity,min_new_capacity == 1,0x10,
               (object_mover)0x0,false);
    if (min_new_capacity != local_1278.m_pitch) {
      memset((vector<crnlib::mip_level_*> *)
             (local_1278._0_8_ + (local_1278._8_8_ & 0xffffffff) * 0x10),0,
             (ulong)(min_new_capacity - local_1278.m_pitch) << 4);
    }
    local_1278.m_pitch = min_new_capacity;
    pcVar8 = this->m_pParams;
  }
LAB_0016b567:
  if (pcVar8->m_faces != 0) {
    local_1280 = local_1238;
    local_1290 = 0;
    do {
      if (pcVar8->m_levels != 0) {
        uVar17 = 0;
        piVar11 = local_1280;
        do {
          this_00 = (mip_level *)crnlib_malloc(0x28);
          mip_level::mip_level(this_00);
          piVar7 = (image_u8 *)crnlib_malloc(0x30);
          piVar7->m_width = 0;
          piVar7->m_height = 0;
          piVar7->m_pitch = 0;
          piVar7->m_total = 0;
          piVar7->m_comp_flags = 0xf;
          piVar7->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          (piVar7->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
          (piVar7->m_pixel_buf).m_size = 0;
          (piVar7->m_pixel_buf).m_capacity = 0;
          piVar7->m_width = piVar11->m_width;
          piVar11->m_width = 0;
          uVar12 = piVar7->m_height;
          piVar7->m_height = piVar11->m_height;
          piVar11->m_height = uVar12;
          uVar12 = piVar7->m_pitch;
          piVar7->m_pitch = piVar11->m_pitch;
          piVar11->m_pitch = uVar12;
          uVar12 = piVar7->m_total;
          piVar7->m_total = piVar11->m_total;
          piVar11->m_total = uVar12;
          uVar12 = piVar7->m_comp_flags;
          piVar7->m_comp_flags = piVar11->m_comp_flags;
          piVar11->m_comp_flags = uVar12;
          piVar7->m_pPixels = piVar11->m_pPixels;
          piVar11->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          pcVar1 = (piVar7->m_pixel_buf).m_p;
          (piVar7->m_pixel_buf).m_p = (piVar11->m_pixel_buf).m_p;
          (piVar11->m_pixel_buf).m_p = pcVar1;
          uVar12 = (piVar7->m_pixel_buf).m_size;
          (piVar7->m_pixel_buf).m_size = (piVar11->m_pixel_buf).m_size;
          (piVar11->m_pixel_buf).m_size = uVar12;
          uVar12 = (piVar7->m_pixel_buf).m_capacity;
          (piVar7->m_pixel_buf).m_capacity = (piVar11->m_pixel_buf).m_capacity;
          (piVar11->m_pixel_buf).m_capacity = uVar12;
          mip_level::assign(this_00,piVar7,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
          pvVar4 = (vector<crnlib::mip_level_*> *)(local_1278._0_8_ + local_1290 * 0x10);
          uVar9 = *(uint *)(local_1278._0_8_ + local_1290 * 0x10 + 8);
          if (*(uint *)(local_1278._0_8_ + local_1290 * 0x10 + 0xc) <= uVar9) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)pvVar4,uVar9 + 1,true,8,(object_mover)0x0,false);
            uVar9 = pvVar4->m_size;
          }
          pvVar4->m_p[uVar9] = this_00;
          pvVar4->m_size = uVar9 + 1;
          uVar17 = uVar17 + 1;
          pcVar8 = this->m_pParams;
          piVar11 = piVar11 + 1;
        } while (uVar17 < pcVar8->m_levels);
      }
      local_1290 = local_1290 + 1;
      local_1280 = local_1280 + 0x10;
    } while (local_1290 < pcVar8->m_faces);
  }
  mipmapped_texture::assign(local_1248,(face_vec *)&local_1278);
  uVar3 = local_1278._0_8_;
  if ((vector<crnlib::mip_level_*> *)local_1278._0_8_ != (vector<crnlib::mip_level_*> *)0x0) {
    uVar17 = local_1278._8_8_ & 0xffffffff;
    if (uVar17 != 0) {
      lVar6 = 0;
      do {
        p = *(void **)(uVar3 + lVar6);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar6 = lVar6 + 0x10;
      } while (uVar17 << 4 != lVar6);
    }
    crnlib_free((void *)local_1278._0_8_);
  }
  bVar5 = true;
LAB_0016b736:
  lVar6 = 0x1200;
  do {
    if (*(void **)((long)&local_1248 + lVar6) != (void *)0x0) {
      crnlib_free(*(void **)((long)&local_1248 + lVar6));
    }
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != 0);
  return bVar5;
}

Assistant:

bool dds_comp::create_dds_tex(mipmapped_texture& dds_tex)
    {
        image_u8 images[cCRNMaxFaces][cCRNMaxLevels];

        bool has_alpha = false;
        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                const uint width = math::maximum(1U, m_pParams->m_width >> level_index);
                const uint height = math::maximum(1U, m_pParams->m_height >> level_index);

                if (!m_pParams->m_pImages[face_index][level_index])
                {
                    return false;
                }

                images[face_index][level_index].alias((color_quad_u8*)m_pParams->m_pImages[face_index][level_index], width, height);
                if (!has_alpha)
                {
                    has_alpha = image_utils::has_alpha(images[face_index][level_index]);
                }
            }
        }

        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                images[face_index][level_index].set_component_valid(3, has_alpha);
            }
        }
        image_utils::conversion_type conv_type = image_utils::get_image_conversion_type_from_crn_format((crn_format)m_pParams->m_format);
        if (conv_type != image_utils::cConversion_Invalid)
        {
            for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
            {
                for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
                {
                    image_u8 cooked_image(images[face_index][level_index]);

                    image_utils::convert_image(cooked_image, conv_type);

                    images[face_index][level_index].swap(cooked_image);
                }
            }
        }

        face_vec faces(m_pParams->m_faces);

        for (uint face_index = 0; face_index < m_pParams->m_faces; face_index++)
        {
            for (uint level_index = 0; level_index < m_pParams->m_levels; level_index++)
            {
                mip_level* pMip = crnlib_new<mip_level>();

                image_u8* pImage = crnlib_new<image_u8>();
                pImage->swap(images[face_index][level_index]);
                pMip->assign(pImage);

                faces[face_index].push_back(pMip);
            }
        }

        dds_tex.assign(faces);
#ifdef CRNLIB_BUILD_DEBUG
        CRNLIB_ASSERT(dds_tex.check());
#endif

        return true;
    }